

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall
streams_tests::streams_buffered_file_skip::test_method(streams_buffered_file_skip *this)

{
  long lVar1;
  ulong uVar2;
  uint8_t j;
  uint8_t obj;
  FILE *__stream;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  assertion_result *paVar4;
  uint8_t *puVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar7;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2a8;
  _IO_FILE *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  lazy_ostream local_150;
  undefined1 *local_140;
  char **local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  uint8_t i;
  BufferedFile bf;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_c8;
  AutoFile local_a8;
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&streams_test_filename,(path *)&local_88,"streams_test_tmp");
  std::filesystem::__cxx11::path::~path(&local_88);
  local_a8.m_file = (FILE *)fsbridge::fopen((char *)&streams_test_filename,"w+b");
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_c8);
  for (obj = '\0'; obj != '('; obj = obj + '\x01') {
    ser_writedata8<AutoFile>(&local_a8,obj);
  }
  rewind((FILE *)local_a8.m_file);
  BufferedFile::BufferedFile(&bf,&local_a8,0x19,10);
  BufferedFile::SkipTo(&bf,7);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x193;
  file.m_begin = (iterator)&local_120;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = (char **)0xc7f1cc;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_158 = "";
  local_1c8._0_8_ = bf.m_read_pos;
  local_1d8 = (char *)CONCAT44(local_1d8._4_4_,7);
  pvVar3 = (iterator)0x2;
  paVar4 = &local_1c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_150,&local_160,0x193,1,2,&local_1c8,"bf.GetPos()",&local_1d8,"7U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x195;
  file_00.m_begin = (iterator)&local_170;
  msg_00.m_end = (iterator)paVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_180,
             msg_00);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = (char **)0xc7f1cc;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_188 = "";
  local_1c8._0_4_ = 7;
  pvVar3 = (iterator)0x2;
  puVar5 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_150,&local_190,0x195,1,2,puVar5,"i",&local_1c8,"7");
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x51ab7f;
  file_01.m_end = (iterator)0x198;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = (iterator)puVar5;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  uVar2 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (bf.nSrcPos >= uVar2) {
    bf.m_read_pos = bf.nSrcPos - uVar2;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(bf.nSrcPos < uVar2 || bf.nSrcPos - uVar2 == 0);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "bf.SetPos(0)";
  local_1d0 = "";
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_1d8;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1e0 = "";
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_150,1,0,WARN,_cVar7,(size_t)&local_1e8,0x198);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  i = ser_readdata8<BufferedFile>(&bf);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x19a;
  file_02.m_begin = (iterator)&local_1f8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_208,
             msg_02);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = (char **)0xc7f1cc;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_210 = "";
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  pvVar3 = (iterator)0x2;
  puVar5 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_150,&local_218,0x19a,1,2,puVar5,"i",&local_1c8,"0");
  i = ser_readdata8<BufferedFile>(&bf);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19c;
  file_03.m_begin = (iterator)&local_228;
  msg_03.m_end = (iterator)puVar5;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_238,
             msg_03);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = (char **)0xc7f1cc;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_240 = "";
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_1c8._1_3_ = 0;
  pvVar3 = (iterator)0x2;
  puVar5 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_150,&local_248,0x19c,1,2,puVar5,"i",&local_1c8,"1");
  BufferedFile::SkipTo(&bf,0xb);
  i = ser_readdata8<BufferedFile>(&bf);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1a0;
  file_04.m_begin = (iterator)&local_258;
  msg_04.m_end = (iterator)puVar5;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_268,
             msg_04);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = (char **)0xc7f1cc;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_270 = "";
  local_1c8._0_4_ = 0xb;
  pvVar3 = (iterator)0x2;
  puVar5 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_150,&local_278,0x1a0,1,2,puVar5,"i",&local_1c8,"11");
  if (bf.m_read_pos < 0xe) {
    bf.nReadLimit = 0xd;
  }
  BufferedFile::SkipTo(&bf,0xe);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x51aeb1;
  file_05.m_end = (iterator)0x1a6;
  file_05.m_begin = (iterator)&local_288;
  msg_05.m_end = (iterator)puVar5;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
             msg_05);
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8 = "false";
  local_1d0 = "";
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = &local_1d8;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2a0 = (_IO_FILE *)0xc514ac;
  pvVar3 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_150,1,0,WARN,_cVar7,(size_t)&local_2a8,0x1a6);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  BufferedFile::SkipTo(&bf,0xd);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2e0 = "";
  local_2f8 = "";
  local_2f0 = "";
  file_06.m_end = (iterator)0x1ad;
  file_06.m_begin = (iterator)&local_2e8;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f8,
             msg_06);
  local_150.m_empty = false;
  local_150._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_140 = boost::unit_test::lazy_ostream::inst;
  local_138 = (char **)0xc7f1cc;
  __stream = (FILE *)&local_308;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_300 = "";
  local_1c8._0_8_ = bf.m_read_pos;
  local_1d8 = (char *)CONCAT44(local_1d8._4_4_,0xd);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_150,__stream,0x1ad,1,2,&local_1c8,"bf.GetPos()",&local_1d8,"13U");
  AutoFile::fclose(&local_a8,__stream);
  std::filesystem::remove((path *)&streams_test_filename);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&local_a8);
  std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file_skip)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};
    // The value at each offset is the byte offset (e.g. byte 1 in the file has the value 0x01).
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    std::rewind(file.Get());

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};

    uint8_t i;
    // This is like bf >> (7-byte-variable), in that it will cause data
    // to be read from the file into memory, but it's not copied to us.
    bf.SkipTo(7);
    BOOST_CHECK_EQUAL(bf.GetPos(), 7U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 7);

    // The bytes in the buffer up to offset 7 are valid and can be read.
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    bf.SkipTo(11);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 11);

    // SkipTo() honors the transfer limit; we can't position beyond the limit.
    bf.SetLimit(13);
    try {
        bf.SkipTo(14);
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(), "Attempt to position past buffer limit") != nullptr);
    }

    // We can position exactly to the transfer limit.
    bf.SkipTo(13);
    BOOST_CHECK_EQUAL(bf.GetPos(), 13U);

    file.fclose();
    fs::remove(streams_test_filename);
}